

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btGImpactCollisionAlgorithm::gimpact_vs_shape
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactShapeInterface *shape0,
          btCollisionShape *shape1,bool swapped)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  btScalar bVar5;
  btTransform *t;
  btCollisionShape *shape;
  btCollisionObject *collisionObject;
  btGImpactCollisionAlgorithm *this_00;
  btCollisionObjectWrapper *body0Wrap_00;
  btCollisionObjectWrapper *this_01;
  GIM_ShapeRetriever *shape0_00;
  btCollisionObjectWrapper *in_RCX;
  btCollisionObjectWrapper *in_RDX;
  btGImpactCollisionAlgorithm *in_RSI;
  btTransform *in_RDI;
  btGImpactShapeInterface *in_R8;
  byte in_R9B;
  btCollisionObjectWrapper *prevObj0;
  btCollisionObjectWrapper ob0;
  btTransform tr0;
  btCollisionShape *colshape0;
  int child_index;
  int i;
  bool child_has_transform0;
  GIM_ShapeRetriever retriever0;
  btAlignedObjectArray<int> collided_results;
  btTransform orgtrans1;
  btTransform orgtrans0;
  btConcaveShape *concaveshape;
  btCompoundShape *compoundshape;
  btStaticPlaneShape *planeshape;
  btGImpactMeshShapePart *shapepart;
  int *part;
  btGImpactMeshShape *meshshape0;
  btScalar in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  GIM_ShapeRetriever *in_stack_fffffffffffffbd0;
  btGImpactShapeInterface *in_stack_fffffffffffffc18;
  GIM_ShapeRetriever *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  btAlignedObjectArray<int> *collided_primitives;
  btCollisionShape *in_stack_fffffffffffffc50;
  btGImpactShapeInterface *in_stack_fffffffffffffc58;
  btTransform *in_stack_fffffffffffffc60;
  btGImpactCollisionAlgorithm *in_stack_fffffffffffffc70;
  btCollisionObjectWrapper *pbVar6;
  btCollisionObjectWrapper local_388;
  undefined1 local_360 [15];
  undefined1 in_stack_fffffffffffffcaf;
  btCompoundShape *in_stack_fffffffffffffcb0;
  btGImpactShapeInterface *in_stack_fffffffffffffcb8;
  btCollisionObjectWrapper *in_stack_fffffffffffffcc0;
  btCollisionObjectWrapper *in_stack_fffffffffffffcc8;
  btGImpactCollisionAlgorithm *in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcef;
  btStaticPlaneShape *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  btCollisionObjectWrapper *in_stack_fffffffffffffd00;
  btGImpactShapeInterface *in_stack_fffffffffffffd08;
  btGImpactCollisionAlgorithm *in_stack_fffffffffffffd10;
  btCollisionObjectWrapper *in_stack_fffffffffffffd18;
  btGImpactCollisionAlgorithm *in_stack_fffffffffffffd20;
  int local_290;
  btAlignedObjectArray<int> local_100 [6];
  btScalar *local_40;
  undefined7 in_stack_ffffffffffffffd0;
  btGImpactCollisionAlgorithm *this_02;
  
  bVar1 = in_R9B & 1;
  iVar4 = (*(code *)in_RCX->m_parent[4].m_parent)();
  if (iVar4 == 2) {
    if ((bVar1 & 1) == 0) {
      local_40 = (in_RDI->m_origin).m_floats + 1;
    }
    else {
      local_40 = (in_RDI->m_origin).m_floats + 3;
    }
    pbVar6 = in_RCX;
    bVar5 = (btScalar)btGImpactMeshShape::getMeshPartCount((btGImpactMeshShape *)0x1d2526);
    *local_40 = bVar5;
    while (bVar5 = *local_40, *local_40 = (btScalar)((int)bVar5 + -1), bVar5 != 0.0) {
      btGImpactMeshShape::getMeshPart
                ((btGImpactMeshShape *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
      gimpact_vs_shape(in_RSI,in_RDX,pbVar6,in_R8,
                       (btCollisionShape *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                       SUB81((ulong)in_RCX >> 0x38,0));
    }
  }
  else {
    iVar4 = (*(code *)in_RCX->m_parent[4].m_parent)();
    if ((iVar4 == 1) &&
       (iVar4 = btCollisionShape::getShapeType((btCollisionShape *)in_R8), iVar4 == 0x1c)) {
      gimpacttrimeshpart_vs_plane_collision
                (in_stack_fffffffffffffd10,(btCollisionObjectWrapper *)in_stack_fffffffffffffd08,
                 in_stack_fffffffffffffd00,
                 (btGImpactMeshShapePart *)
                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                 in_stack_fffffffffffffcf0,(bool)in_stack_fffffffffffffcef);
    }
    else {
      bVar2 = btCollisionShape::isCompound((btCollisionShape *)0x1d2652);
      if (bVar2) {
        gimpact_vs_compoundshape
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                   in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   (bool)in_stack_fffffffffffffcaf);
      }
      else {
        bVar2 = btCollisionShape::isConcave((btCollisionShape *)0x1d26b4);
        if (bVar2) {
          gimpact_vs_concave(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                             (btCollisionObjectWrapper *)in_stack_fffffffffffffd10,
                             in_stack_fffffffffffffd08,(btConcaveShape *)in_stack_fffffffffffffd00,
                             (bool)in_stack_fffffffffffffcff);
        }
        else {
          btCollisionObjectWrapper::getWorldTransform((btCollisionObjectWrapper *)in_RSI);
          btTransform::btTransform
                    ((btTransform *)in_stack_fffffffffffffbd0,
                     (btTransform *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
          btCollisionObjectWrapper::getWorldTransform(in_RDX);
          btTransform::btTransform
                    ((btTransform *)in_stack_fffffffffffffbd0,
                     (btTransform *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
          collided_primitives = local_100;
          btAlignedObjectArray<int>::btAlignedObjectArray
                    ((btAlignedObjectArray<int> *)in_stack_fffffffffffffbd0);
          gimpact_vs_shape_find_pairs
                    (in_stack_fffffffffffffc70,in_RDI,in_stack_fffffffffffffc60,
                     in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,collided_primitives);
          iVar4 = btAlignedObjectArray<int>::size(local_100);
          if (iVar4 != 0) {
            (*(code *)in_RCX->m_parent[5].m_worldTransform)();
            GIM_ShapeRetriever::GIM_ShapeRetriever
                      (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            bVar3 = (*(code *)in_RCX->m_parent[4].m_worldTransform)();
            iVar4 = btAlignedObjectArray<int>::size(local_100);
            local_290 = iVar4;
            while (local_290 != 0) {
              t = (btTransform *)btAlignedObjectArray<int>::operator[](local_100,local_290 + -1);
              bVar5 = (t->m_basis).m_el[0].m_floats[0];
              if ((bVar1 & 1) == 0) {
                (in_RDI->m_origin).m_floats[0] = bVar5;
              }
              else {
                (in_RDI->m_origin).m_floats[2] = bVar5;
              }
              shape = GIM_ShapeRetriever::getChildShape
                                (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
              btCollisionObjectWrapper::getWorldTransform((btCollisionObjectWrapper *)in_RSI);
              btTransform::btTransform
                        ((btTransform *)in_stack_fffffffffffffbd0,
                         (btTransform *)
                         CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
              this_02 = in_RSI;
              if ((bVar3 & 1) != 0) {
                (*(code *)in_RCX->m_parent[6].m_worldTransform)(local_360,in_RCX,bVar5);
                btTransform::operator*((btTransform *)CONCAT44(iVar4,in_stack_fffffffffffffc28),t);
                btTransform::operator=
                          ((btTransform *)in_stack_fffffffffffffbd0,
                           (btTransform *)
                           CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
                this_02 = in_RSI;
              }
              in_RSI = this_02;
              collisionObject =
                   btCollisionObjectWrapper::getCollisionObject((btCollisionObjectWrapper *)this_02)
              ;
              this_00 = (btGImpactCollisionAlgorithm *)
                        btCollisionObjectWrapper::getWorldTransform
                                  ((btCollisionObjectWrapper *)in_RSI);
              in_stack_fffffffffffffbc8 = (in_RDI->m_origin).m_floats[0];
              btCollisionObjectWrapper::btCollisionObjectWrapper
                        (&local_388,(btCollisionObjectWrapper *)this_02,shape,collisionObject,
                         (btTransform *)this_00,(int)(in_RDI->m_origin).m_floats[1],
                         (int)in_stack_fffffffffffffbc8);
              body0Wrap_00 = btManifoldResult::getBody0Wrap
                                       (*(btManifoldResult **)(in_RDI->m_basis).m_el[2].m_floats);
              pbVar6 = body0Wrap_00;
              this_01 = btManifoldResult::getBody0Wrap
                                  (*(btManifoldResult **)(in_RDI->m_basis).m_el[2].m_floats);
              shape0_00 = (GIM_ShapeRetriever *)
                          btCollisionObjectWrapper::getCollisionObject(this_01);
              in_stack_fffffffffffffbd0 =
                   (GIM_ShapeRetriever *)btCollisionObjectWrapper::getCollisionObject(&local_388);
              if (shape0_00 == in_stack_fffffffffffffbd0) {
                btManifoldResult::setBody0Wrap
                          (*(btManifoldResult **)(in_RDI->m_basis).m_el[2].m_floats,&local_388);
              }
              else {
                btManifoldResult::setBody1Wrap
                          (*(btManifoldResult **)(in_RDI->m_basis).m_el[2].m_floats,&local_388);
              }
              if ((bVar1 & 1) == 0) {
                shape_vs_shape_collision
                          (this_00,body0Wrap_00,this_01,(btCollisionShape *)shape0_00,
                           (btCollisionShape *)in_stack_fffffffffffffbd0);
              }
              else {
                shape_vs_shape_collision
                          (this_00,body0Wrap_00,this_01,(btCollisionShape *)shape0_00,
                           (btCollisionShape *)in_stack_fffffffffffffbd0);
              }
              btManifoldResult::setBody0Wrap
                        (*(btManifoldResult **)(in_RDI->m_basis).m_el[2].m_floats,pbVar6);
              local_290 = local_290 + -1;
            }
            (**(code **)&in_RCX->m_parent[5].m_partId)();
            GIM_ShapeRetriever::~GIM_ShapeRetriever(in_stack_fffffffffffffbd0);
          }
          btAlignedObjectArray<int>::~btAlignedObjectArray((btAlignedObjectArray<int> *)0x1d2b81);
        }
      }
    }
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpact_vs_shape(const btCollisionObjectWrapper* body0Wrap,
				  const btCollisionObjectWrapper * body1Wrap,
				  const btGImpactShapeInterface * shape0,
				  const btCollisionShape * shape1,bool swapped)
{
	if(shape0->getGImpactShapeType()==CONST_GIMPACT_TRIMESH_SHAPE)
	{
		const btGImpactMeshShape * meshshape0 = static_cast<const btGImpactMeshShape *>(shape0);
		int& part = swapped ? m_part1 : m_part0;
		part = meshshape0->getMeshPartCount();

		while(part--)
		{

			gimpact_vs_shape(body0Wrap,
				  body1Wrap,
				  meshshape0->getMeshPart(part),
				  shape1,swapped);

		}

		return;
	}

	#ifdef GIMPACT_VS_PLANE_COLLISION
	if(shape0->getGImpactShapeType() == CONST_GIMPACT_TRIMESH_SHAPE_PART &&
		shape1->getShapeType() == STATIC_PLANE_PROXYTYPE)
	{
		const btGImpactMeshShapePart * shapepart = static_cast<const btGImpactMeshShapePart *>(shape0);
		const btStaticPlaneShape * planeshape = static_cast<const btStaticPlaneShape * >(shape1);
		gimpacttrimeshpart_vs_plane_collision(body0Wrap,body1Wrap,shapepart,planeshape,swapped);
		return;
	}

	#endif



	if(shape1->isCompound())
	{
		const btCompoundShape * compoundshape = static_cast<const btCompoundShape *>(shape1);
		gimpact_vs_compoundshape(body0Wrap,body1Wrap,shape0,compoundshape,swapped);
		return;
	}
	else if(shape1->isConcave())
	{
		const btConcaveShape * concaveshape = static_cast<const btConcaveShape *>(shape1);
		gimpact_vs_concave(body0Wrap,body1Wrap,shape0,concaveshape,swapped);
		return;
	}


	btTransform orgtrans0 = body0Wrap->getWorldTransform();

	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	btAlignedObjectArray<int> collided_results;

	gimpact_vs_shape_find_pairs(orgtrans0,orgtrans1,shape0,shape1,collided_results);

	if(collided_results.size() == 0) return;


	shape0->lockChildShapes();

	GIM_ShapeRetriever retriever0(shape0);


	bool child_has_transform0 = shape0->childrenHasTransform();


	int i = collided_results.size();

	while(i--)
	{
		int child_index = collided_results[i];
        if(swapped)
    		m_triface1 = child_index;
        else
            m_triface0 = child_index;

		const btCollisionShape * colshape0 = retriever0.getChildShape(child_index);

		btTransform tr0 = body0Wrap->getWorldTransform();

		if(child_has_transform0)
		{
			tr0 = orgtrans0*shape0->getChildTransform(child_index);
		}

		btCollisionObjectWrapper ob0(body0Wrap,colshape0,body0Wrap->getCollisionObject(),body0Wrap->getWorldTransform(),m_part0,m_triface0);
		const btCollisionObjectWrapper* prevObj0 = m_resultOut->getBody0Wrap();
		
		if (m_resultOut->getBody0Wrap()->getCollisionObject()==ob0.getCollisionObject())
		{
			m_resultOut->setBody0Wrap(&ob0);
		} else
		{
			m_resultOut->setBody1Wrap(&ob0);
		}

		//collide two shapes
		if(swapped)
		{
			
			shape_vs_shape_collision(body1Wrap,&ob0,shape1,colshape0);
		}
		else
		{
			
			shape_vs_shape_collision(&ob0,body1Wrap,colshape0,shape1);
		}
		m_resultOut->setBody0Wrap(prevObj0);

	}

	shape0->unlockChildShapes();

}